

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::GetArrayCopy<aiVector3t<float>>(aiVector3t<float> **dest,ai_uint num)

{
  aiVector3t<float> *__src;
  aiVector3t<float> *__s;
  ulong __n;
  
  __src = *dest;
  if (__src != (aiVector3t<float> *)0x0) {
    __n = (ulong)num * 0xc;
    __s = (aiVector3t<float> *)operator_new__(__n);
    if (num != 0) {
      memset(__s,0,((__n - 0xc) - (__n - 0xc) % 0xc) + 0xc);
    }
    *dest = __s;
    memcpy(__s,__src,__n);
    return;
  }
  return;
}

Assistant:

inline
void GetArrayCopy(Type*& dest, ai_uint num ) {
    if ( !dest ) {
        return;
    }
    Type* old = dest;

    dest = new Type[num];
    ::memcpy(dest, old, sizeof(Type) * num);
}